

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

void ON_ExtrusionCopyHelper(ON_Extrusion *src,ON_Extrusion *dst)

{
  int iVar1;
  undefined4 extraout_var;
  ON_Curve *local_28;
  ON_Extrusion *dst_local;
  ON_Extrusion *src_local;
  
  if (src != dst) {
    if (dst->m_profile != (ON_Curve *)0x0) {
      if (dst->m_profile != (ON_Curve *)0x0) {
        (*(dst->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      dst->m_profile = (ON_Curve *)0x0;
    }
    memcpy(&dst->m_path,&src->m_path,0x30);
    (dst->m_t).m_t[0] = (src->m_t).m_t[0];
    (dst->m_t).m_t[1] = (src->m_t).m_t[1];
    (dst->m_up).x = (src->m_up).x;
    (dst->m_up).y = (src->m_up).y;
    (dst->m_up).z = (src->m_up).z;
    dst->m_profile_count = src->m_profile_count;
    if (src->m_profile == (ON_Curve *)0x0) {
      local_28 = (ON_Curve *)0x0;
    }
    else {
      iVar1 = (*(src->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      local_28 = (ON_Curve *)CONCAT44(extraout_var,iVar1);
    }
    dst->m_profile = local_28;
    dst->m_bCap[0] = (bool)(src->m_bCap[0] & 1);
    dst->m_bCap[1] = (bool)(src->m_bCap[1] & 1);
    dst->m_bHaveN[0] = (bool)(src->m_bHaveN[0] & 1);
    dst->m_bHaveN[1] = (bool)(src->m_bHaveN[1] & 1);
    dst->m_N[0].x = src->m_N[0].x;
    dst->m_N[0].y = src->m_N[0].y;
    dst->m_N[0].z = src->m_N[0].z;
    dst->m_N[1].x = src->m_N[1].x;
    dst->m_N[1].y = src->m_N[1].y;
    dst->m_N[1].z = src->m_N[1].z;
    (dst->m_path_domain).m_t[0] = (src->m_path_domain).m_t[0];
    (dst->m_path_domain).m_t[1] = (src->m_path_domain).m_t[1];
    dst->m_bTransposed = (bool)(src->m_bTransposed & 1);
    ON_MeshCache::operator=(&dst->m_mesh_cache,&src->m_mesh_cache);
  }
  return;
}

Assistant:

static void ON_ExtrusionCopyHelper(const ON_Extrusion& src,ON_Extrusion& dst)
{
  if ( &src != &dst )
  {
    if ( dst.m_profile )
    {
      delete dst.m_profile;
      dst.m_profile = 0;
    }
    dst.m_path = src.m_path;
    dst.m_t = src.m_t;
    dst.m_up = src.m_up;
    dst.m_profile_count = src.m_profile_count;
    dst.m_profile = src.m_profile 
                  ? src.m_profile->DuplicateCurve() 
                  : 0;
    dst.m_bCap[0] = src.m_bCap[0];
    dst.m_bCap[1] = src.m_bCap[1];
    dst.m_bHaveN[0] = src.m_bHaveN[0];
    dst.m_bHaveN[1] = src.m_bHaveN[1];
    dst.m_N[0] = src.m_N[0];
    dst.m_N[1] = src.m_N[1];
    dst.m_path_domain = src.m_path_domain;
    dst.m_bTransposed  = src.m_bTransposed;
    dst.m_mesh_cache = src.m_mesh_cache;
  }
}